

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkingDirectory.cxx
# Opt level: O1

void __thiscall cmWorkingDirectory::cmWorkingDirectory(cmWorkingDirectory *this,string *newdir)

{
  long *local_40 [2];
  long local_30 [2];
  
  (this->OldDir)._M_dataplus._M_p = (pointer)&(this->OldDir).field_2;
  (this->OldDir)._M_string_length = 0;
  (this->OldDir).field_2._M_local_buf[0] = '\0';
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  std::__cxx11::string::operator=((string *)this,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  SetDirectory(this,newdir);
  return;
}

Assistant:

cmWorkingDirectory::cmWorkingDirectory(std::string const& newdir)
{
  this->OldDir = cmSystemTools::GetCurrentWorkingDirectory();
  this->SetDirectory(newdir);
}